

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_ostream.hpp
# Opt level: O2

ostream * __thiscall
boost::unit_test::
lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
::operator()(lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
             *this,ostream *ostr)

{
  int iVar1;
  undefined4 extraout_var;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  
  iVar1 = (*this->m_prev->_vptr_lazy_ostream[2])();
  pbVar2 = unit_test::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)CONCAT44(extraout_var,iVar1),
                      this->m_value);
  return pbVar2;
}

Assistant:

virtual std::ostream&   operator()( std::ostream& ostr ) const
    {
        return m_prev(ostr) << m_value;
    }